

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t utf16nbytes(void *_p,size_t n)

{
  bool bVar1;
  char *local_38;
  char *pp;
  char *p;
  size_t s;
  size_t n_local;
  void *_p_local;
  
  if (_p == (void *)0x0) {
    _p_local = (void *)0x0;
  }
  else {
    p = (char *)0x0;
    local_38 = (char *)_p;
    while( true ) {
      bVar1 = false;
      if ((p < (char *)(n >> 1)) && (bVar1 = true, *local_38 == '\0')) {
        bVar1 = local_38[1] != '\0';
      }
      if (!bVar1) break;
      local_38 = local_38 + 2;
      p = p + 1;
    }
    _p_local = (void *)((long)p << 1);
  }
  return (size_t)_p_local;
}

Assistant:

static size_t
utf16nbytes(const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	if (_p == NULL)
		return (0);
	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	n >>= 1;
	while (s < n && (pp[0] || pp[1])) {
		pp += 2;
		s++;
	}
	return (s<<1);
}